

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

void Gia_ManPrintRepr(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  ulong uVar2;
  
  for (uVar2 = 0; (long)uVar2 < (long)p->nObjs; uVar2 = uVar2 + 1) {
    pGVar1 = Gia_ManObj(p,(int)uVar2);
    if (pGVar1 == (Gia_Obj_t *)0x0) break;
    if (p->pReprsOld[uVar2] != -1) {
      printf("%d->%d ",uVar2 & 0xffffffff,(ulong)((uint)p->pReprs[uVar2] & 0xfffffff));
    }
  }
  putchar(10);
  return;
}

Assistant:

void Gia_ManPrintRepr( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachObj( p, pObj, i )
        if ( ~p->pReprsOld[i] )
            printf( "%d->%d ", i, p->pReprs[i].iRepr );
    printf( "\n" );
}